

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.hpp
# Opt level: O0

void __thiscall
so_5::subscription_bind_t::ensure_handler_can_be_used_with_mbox
          (subscription_bind_t *this,msg_type_and_handler_pair_t *handler)

{
  int iVar1;
  abstract_message_box_t *paVar2;
  allocator local_59;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  msg_type_and_handler_pair_t *local_18;
  msg_type_and_handler_pair_t *handler_local;
  subscription_bind_t *this_local;
  
  if (handler->m_mutability == mutable_message) {
    local_18 = handler;
    handler_local = (msg_type_and_handler_pair_t *)this;
    paVar2 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(&this->m_mbox_ref);
    iVar1 = (*paVar2->_vptr_abstract_message_box_t[6])();
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_58,"subscription to mutable message from MPMC mbox is disabled, msg_type=",
                 &local_59);
      std::type_index::name(&local_18->m_msg_type);
      std::operator+(local_38,(char *)local_58);
      exception_t::raise(0x51a2b1);
      std::__cxx11::string::~string((string *)local_38);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
  }
  return;
}

Assistant:

inline void
subscription_bind_t::ensure_handler_can_be_used_with_mbox(
	const so_5::details::msg_type_and_handler_pair_t & handler ) const
{
	if( message_mutability_t::mutable_message == handler.m_mutability &&
			mbox_type_t::multi_producer_multi_consumer == m_mbox_ref->type() )
		SO_5_THROW_EXCEPTION( rc_subscription_to_mutable_msg_from_mpmc_mbox,
				std::string( "subscription to mutable message from MPMC mbox "
						"is disabled, msg_type=" )
				+ handler.m_msg_type.name() );
}